

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void render(size_t *width,size_t *height,
           vector<Vec<3UL,_float>,_std::allocator<Vec<3UL,_float>_>_> *buffer,float interocular)

{
  allocator<Vec<3UL,_float>_> *this;
  undefined8 uVar1;
  float fVar2;
  size_t sVar3;
  size_type sVar4;
  reference pvVar5;
  reference pvVar6;
  Pos<3UL,_float> PVar7;
  ulong local_148;
  size_t i_1;
  size_t j_1;
  size_t i;
  size_t j;
  Pos3f orig_cam_pos;
  Vec3f eye_transformation;
  vector<Vec<3UL,_float>,_std::allocator<Vec<3UL,_float>_>_> right_buffer;
  allocator<Vec<3UL,_float>_> local_59;
  undefined1 local_58 [8];
  vector<Vec<3UL,_float>,_std::allocator<Vec<3UL,_float>_>_> left_buffer;
  size_t right_width;
  size_t left_width;
  Scene *scene;
  vector<Vec<3UL,_float>,_std::allocator<Vec<3UL,_float>_>_> *pvStack_20;
  float interocular_local;
  vector<Vec<3UL,_float>,_std::allocator<Vec<3UL,_float>_>_> *buffer_local;
  size_t *height_local;
  size_t *width_local;
  
  scene._4_4_ = interocular;
  pvStack_20 = buffer;
  buffer_local = (vector<Vec<3UL,_float>,_std::allocator<Vec<3UL,_float>_>_> *)height;
  height_local = width;
  left_width = (size_t)setup_scene();
  if ((scene._4_4_ != 0.0) || (NAN(scene._4_4_))) {
    right_width = *height_local >> 1;
    left_buffer.super__Vector_base<Vec<3UL,_float>,_std::allocator<Vec<3UL,_float>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)(*height_local - right_width);
    sVar4 = right_width *
            (long)(buffer_local->
                  super__Vector_base<Vec<3UL,_float>,_std::allocator<Vec<3UL,_float>_>_>)._M_impl.
                  super__Vector_impl_data._M_start;
    std::allocator<Vec<3UL,_float>_>::allocator(&local_59);
    std::vector<Vec<3UL,_float>,_std::allocator<Vec<3UL,_float>_>_>::vector
              ((vector<Vec<3UL,_float>,_std::allocator<Vec<3UL,_float>_>_> *)local_58,sVar4,
               &local_59);
    std::allocator<Vec<3UL,_float>_>::~allocator(&local_59);
    sVar4 = right_width *
            (long)(buffer_local->
                  super__Vector_base<Vec<3UL,_float>,_std::allocator<Vec<3UL,_float>_>_>)._M_impl.
                  super__Vector_impl_data._M_start;
    this = (allocator<Vec<3UL,_float>_> *)((long)&eye_transformation.y + 3);
    std::allocator<Vec<3UL,_float>_>::allocator(this);
    std::vector<Vec<3UL,_float>,_std::allocator<Vec<3UL,_float>_>_>::vector
              ((vector<Vec<3UL,_float>,_std::allocator<Vec<3UL,_float>_>_> *)&eye_transformation.z,
               sVar4,this);
    std::allocator<Vec<3UL,_float>_>::~allocator
              ((allocator<Vec<3UL,_float>_> *)((long)&eye_transformation.y + 3));
    Vec<3UL,_float>::Vec((Vec<3UL,_float> *)&orig_cam_pos.z,scene._4_4_ * 0.5,0.0,0.0);
    orig_cam_pos.x = *(float *)(left_width + 8);
    uVar1 = *(undefined8 *)left_width;
    PVar7 = operator+(*(Pos<3UL,_float> *)left_width,(Vec<3UL,_float> *)&orig_cam_pos.z);
    *(float *)(left_width + 8) = PVar7.z;
    *(long *)left_width = PVar7._0_8_;
    Scene::render((Scene *)left_width,&right_width,(size_t *)buffer_local,
                  (vector<Vec<3UL,_float>,_std::allocator<Vec<3UL,_float>_>_> *)local_58);
    PVar7.z = orig_cam_pos.x;
    PVar7.x = (float)(int)uVar1;
    PVar7.y = (float)(int)((ulong)uVar1 >> 0x20);
    PVar7 = operator-(PVar7,(Vec<3UL,_float> *)&orig_cam_pos.z);
    *(float *)(left_width + 8) = PVar7.z;
    *(long *)left_width = PVar7._0_8_;
    Scene::render((Scene *)left_width,
                  (size_t *)
                  &left_buffer.
                   super__Vector_base<Vec<3UL,_float>,_std::allocator<Vec<3UL,_float>_>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage,(size_t *)buffer_local,
                  (vector<Vec<3UL,_float>,_std::allocator<Vec<3UL,_float>_>_> *)
                  &eye_transformation.z);
    *(undefined8 *)left_width = uVar1;
    *(float *)(left_width + 8) = orig_cam_pos.x;
    for (i = 0; i < (buffer_local->
                    super__Vector_base<Vec<3UL,_float>,_std::allocator<Vec<3UL,_float>_>_>)._M_impl.
                    super__Vector_impl_data._M_start; i = i + 1) {
      for (j_1 = 0; j_1 < right_width; j_1 = j_1 + 1) {
        pvVar5 = std::vector<Vec<3UL,_float>,_std::allocator<Vec<3UL,_float>_>_>::operator[]
                           ((vector<Vec<3UL,_float>,_std::allocator<Vec<3UL,_float>_>_> *)local_58,
                            j_1 + i * right_width);
        pvVar6 = std::vector<Vec<3UL,_float>,_std::allocator<Vec<3UL,_float>_>_>::operator[]
                           (pvStack_20,j_1 + i * *height_local);
        fVar2 = pvVar5->y;
        pvVar6->x = pvVar5->x;
        pvVar6->y = fVar2;
        pvVar6->z = pvVar5->z;
      }
    }
    for (i_1 = 0; i_1 < (buffer_local->
                        super__Vector_base<Vec<3UL,_float>,_std::allocator<Vec<3UL,_float>_>_>).
                        _M_impl.super__Vector_impl_data._M_start; i_1 = i_1 + 1) {
      for (local_148 = 0; local_148 < right_width; local_148 = local_148 + 1) {
        pvVar5 = std::vector<Vec<3UL,_float>,_std::allocator<Vec<3UL,_float>_>_>::operator[]
                           ((vector<Vec<3UL,_float>,_std::allocator<Vec<3UL,_float>_>_> *)
                            &eye_transformation.z,
                            local_148 +
                            i_1 * (long)left_buffer.
                                        super__Vector_base<Vec<3UL,_float>,_std::allocator<Vec<3UL,_float>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
        pvVar6 = std::vector<Vec<3UL,_float>,_std::allocator<Vec<3UL,_float>_>_>::operator[]
                           (pvStack_20,local_148 + right_width + i_1 * *height_local);
        fVar2 = pvVar5->y;
        pvVar6->x = pvVar5->x;
        pvVar6->y = fVar2;
        pvVar6->z = pvVar5->z;
      }
    }
    std::vector<Vec<3UL,_float>,_std::allocator<Vec<3UL,_float>_>_>::~vector
              ((vector<Vec<3UL,_float>,_std::allocator<Vec<3UL,_float>_>_> *)&eye_transformation.z);
    std::vector<Vec<3UL,_float>,_std::allocator<Vec<3UL,_float>_>_>::~vector
              ((vector<Vec<3UL,_float>,_std::allocator<Vec<3UL,_float>_>_> *)local_58);
  }
  else {
    Scene::render((Scene *)left_width,height_local,(size_t *)buffer_local,pvStack_20);
  }
  sVar3 = left_width;
  if (left_width != 0) {
    Scene::~Scene((Scene *)left_width);
    operator_delete((void *)sVar3,0x68);
  }
  return;
}

Assistant:

void render(const size_t &width, const size_t &height, std::vector<Vec3f> &buffer, const float interocular = 0) {
    Scene *scene = setup_scene();

    // Render a side-by-side 3d rendering if the interocular distance is nonzero.
    if (interocular == 0) {
        scene->render(width, height, buffer);
    } else {
        // Use two buffers in case of odd resolutions.
        const size_t left_width = width / 2;
        const size_t right_width = width - left_width;
        std::vector<Vec3f> left_buffer(left_width * height);
        std::vector<Vec3f> right_buffer(left_width * height);

        Vec3f eye_transformation(interocular / 2, 0, 0);
        Pos3f orig_cam_pos = scene->camera.position;

        // Render the left eye.
        scene->camera.position = orig_cam_pos + eye_transformation;
        scene->render(left_width, height, left_buffer);

        // Now the right.
        scene->camera.position = orig_cam_pos - eye_transformation;
        scene->render(right_width, height, right_buffer);

        // Don't forget to reset the camera position.
        scene->camera.position = orig_cam_pos;

        // Stitch the views together into the output buffer.
        for (size_t j = 0; j < height; j++) {
            for (size_t i = 0; i < left_width; i++) {
                buffer[i + j * width] = left_buffer[i + j * left_width];
            }
        }
        for (size_t j = 0; j < height; j++) {
            for (size_t i = 0; i < left_width; i++) {
                buffer[i + left_width + j * width] = right_buffer[i + j * right_width];
            }
        }
    }

    delete scene;
}